

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tensor.h
# Opt level: O1

unique_ptr<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_> __thiscall
YacclabTensorOutput2D::Copy(YacclabTensorOutput2D *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  Mat aMStack_78 [96];
  
  pp_Var1 = (_func_int **)operator_new(0x68);
  cv::Mat::Mat(aMStack_78,(Mat *)(in_RSI + 8));
  *pp_Var1 = (_func_int *)&PTR_Release_00331970;
  cv::Mat::Mat((Mat *)(pp_Var1 + 1),aMStack_78);
  cv::Mat::~Mat(aMStack_78);
  (this->super_YacclabTensorOutput).super_YacclabTensor._vptr_YacclabTensor = pp_Var1;
  return (__uniq_ptr_data<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>,_true,_true>
         )(__uniq_ptr_data<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>,_true,_true>
           )this;
}

Assistant:

virtual std::unique_ptr<YacclabTensorOutput> Copy() const override {  return std::make_unique<YacclabTensorOutput2D>(mat_);  }